

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omptarget.cpp
# Opt level: O1

int target_data_end(DeviceTy *Device,int32_t arg_num,void **args_base,void **args,int64_t *arg_sizes
                   ,int64_t *arg_types)

{
  undefined8 *HstPtrBegin;
  ulong uVar1;
  undefined8 *puVar2;
  byte bVar3;
  int iVar4;
  void *pvVar5;
  long lVar6;
  iterator __position;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  bool bVar11;
  bool IsLast;
  bool local_7d;
  uint local_7c;
  ulong local_78;
  DeviceTy *local_70;
  void **local_68;
  int64_t *local_60;
  pthread_mutex_t *local_58;
  void **local_50;
  _Base_ptr local_48;
  _Rb_tree<void*,std::pair<void*const,ShadowPtrValTy>,std::_Select1st<std::pair<void*const,ShadowPtrValTy>>,std::less<void*>,std::allocator<std::pair<void*const,ShadowPtrValTy>>>
  *local_40;
  ulong local_38;
  
  if (arg_num < 1) {
    local_7c = 0;
  }
  else {
    local_58 = (pthread_mutex_t *)&Device->ShadowMtx;
    local_40 = (_Rb_tree<void*,std::pair<void*const,ShadowPtrValTy>,std::_Select1st<std::pair<void*const,ShadowPtrValTy>>,std::less<void*>,std::allocator<std::pair<void*const,ShadowPtrValTy>>>
                *)&Device->ShadowPtrMap;
    local_48 = &(Device->ShadowPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_7c = 0;
    uVar9 = (ulong)(uint)arg_num;
    local_70 = Device;
    local_68 = args;
    local_60 = arg_sizes;
    local_50 = args_base;
    do {
      uVar8 = uVar9 - 1;
      local_38 = arg_sizes[uVar9 - 1];
      uVar7 = (uint)local_38;
      if ((local_38 & 0x180) == 0) {
        HstPtrBegin = (undefined8 *)local_50[uVar8];
        pvVar5 = DeviceTy::getTgtPtrBegin
                           (Device,HstPtrBegin,(int64_t)local_68[uVar8],&local_7d,
                            (bool)((byte)((uVar7 & 0x10) >> 4) | local_38 < 0x1000000000000));
        uVar1 = local_60[uVar8];
        bVar3 = (byte)(((uint)uVar1 & 0x10) >> 4) | uVar1 < 0x1000000000000;
        bVar10 = ((byte)((uVar7 & 8) >> 3) | local_7d) & bVar3;
        local_78 = uVar8;
        if (((uVar1 & 2) != 0) || (arg_sizes = local_60, Device = local_70, bVar10 != 0)) {
          if ((uVar1 & 2) != 0) {
            if (bVar3 == 0) {
              lVar6 = DeviceTy::getMapEntryRefCnt
                                (local_70,local_50[(long)(uVar1 - 0x1000000000000) >> 0x30]);
              bVar11 = lVar6 == 1;
            }
            else {
              bVar11 = false;
            }
            uVar8 = local_78;
            if ((byte)((byte)(((uint)uVar1 & 4) >> 2) | bVar11 | bVar10) == 1) {
              iVar4 = (*(code *)local_70->RTL->data_retrieve)
                                (local_70->RTLDeviceID,HstPtrBegin,pvVar5,local_68[local_78]);
              local_7c = local_7c | -(uint)(iVar4 != 0);
            }
          }
          pvVar5 = local_68[uVar8];
          iVar4 = pthread_mutex_lock(local_58);
          if (iVar4 != 0) {
            std::__throw_system_error(iVar4);
          }
          __position._M_node =
               (local_70->ShadowPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          if (__position._M_node != local_48) {
            do {
              puVar2 = *(undefined8 **)(__position._M_node + 1);
              iVar4 = 7;
              if ((HstPtrBegin <= puVar2) &&
                 (iVar4 = 5, puVar2 < (undefined8 *)((long)pvVar5 + (long)HstPtrBegin))) {
                if ((*(byte *)(local_60 + local_78) & 2) != 0) {
                  *puVar2 = __position._M_node[1]._M_parent;
                }
                iVar4 = 0;
                if (bVar10 != 0) {
                  std::
                  _Rb_tree<void*,std::pair<void*const,ShadowPtrValTy>,std::_Select1st<std::pair<void*const,ShadowPtrValTy>>,std::less<void*>,std::allocator<std::pair<void*const,ShadowPtrValTy>>>
                  ::erase_abi_cxx11_(local_40,__position);
                }
              }
            } while (((iVar4 == 7) || (iVar4 == 0)) &&
                    (__position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node),
                    __position._M_node != local_48));
          }
          pthread_mutex_unlock(local_58);
          Device = local_70;
          uVar8 = local_78;
          arg_sizes = local_60;
          if (bVar10 != 0) {
            iVar4 = DeviceTy::deallocTgtPtr
                              (local_70,HstPtrBegin,(int64_t)local_68[local_78],
                               SUB41(((uint)local_38 & 8) >> 3,0));
            local_7c = local_7c | -(uint)(iVar4 != 0);
            arg_sizes = local_60;
          }
        }
      }
      bVar11 = 1 < (long)uVar9;
      uVar9 = uVar8;
    } while (bVar11);
  }
  return local_7c;
}

Assistant:

static int target_data_end(DeviceTy &Device, int32_t arg_num, void **args_base,
    void **args, int64_t *arg_sizes, int64_t *arg_types) {
  int rc = OFFLOAD_SUCCESS;
  // process each input.
  for (int32_t i = arg_num - 1; i >= 0; --i) {
    // Ignore private variables and arrays - there is no mapping for them.
    // Also, ignore the use_device_ptr directive, it has no effect here.
    if ((arg_types[i] & OMP_TGT_MAPTYPE_LITERAL) ||
        (arg_types[i] & OMP_TGT_MAPTYPE_PRIVATE))
      continue;

    void *HstPtrBegin = args[i];
    bool IsLast;
    bool UpdateRef = !(arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) ||
        (arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ);
    bool ForceDelete = arg_types[i] & OMP_TGT_MAPTYPE_DELETE;

    // If PTR_AND_OBJ, HstPtrBegin is address of pointee
    void *TgtPtrBegin = Device.getTgtPtrBegin(HstPtrBegin, arg_sizes[i], IsLast,
        UpdateRef);
    DP("There are %" PRId64 " bytes allocated at target address " DPxMOD
        " - is%s last\n", arg_sizes[i], DPxPTR(TgtPtrBegin),
        (IsLast ? "" : " not"));

    bool DelEntry = IsLast || ForceDelete;

    if ((arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) &&
        !(arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ)) {
      DelEntry = false; // protect parent struct from being deallocated
    }

    if ((arg_types[i] & OMP_TGT_MAPTYPE_FROM) || DelEntry) {
      // Move data back to the host
      if (arg_types[i] & OMP_TGT_MAPTYPE_FROM) {
        bool Always = arg_types[i] & OMP_TGT_MAPTYPE_ALWAYS;
        bool CopyMember = false;
        if ((arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) &&
            !(arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ)) {
          // Copy data only if the "parent" struct has RefCount==1.
          short parent_idx = member_of(arg_types[i]);
          long parent_rc = Device.getMapEntryRefCnt(args[parent_idx]);
          assert(parent_rc > 0 && "parent struct not found");
          if (parent_rc == 1) {
            CopyMember = true;
          }
        }

        if (DelEntry || Always || CopyMember) {
          DP("Moving %" PRId64 " bytes (tgt:" DPxMOD ") -> (hst:" DPxMOD ")\n",
              arg_sizes[i], DPxPTR(TgtPtrBegin), DPxPTR(HstPtrBegin));
          int rt = Device.data_retrieve(HstPtrBegin, TgtPtrBegin, arg_sizes[i]);
          if (rt != OFFLOAD_SUCCESS) {
            DP("Copying data from device failed.\n");
            rc = OFFLOAD_FAIL;
          }
        }
      }

      // If we copied back to the host a struct/array containing pointers, we
      // need to restore the original host pointer values from their shadow
      // copies. If the struct is going to be deallocated, remove any remaining
      // shadow pointer entries for this struct.
      uintptr_t lb = (uintptr_t) HstPtrBegin;
      uintptr_t ub = (uintptr_t) HstPtrBegin + arg_sizes[i];
      Device.ShadowMtx.lock();
      for (ShadowPtrListTy::iterator it = Device.ShadowPtrMap.begin();
          it != Device.ShadowPtrMap.end(); ++it) {
        void **ShadowHstPtrAddr = (void**) it->first;

        // An STL map is sorted on its keys; use this property
        // to quickly determine when to break out of the loop.
        if ((uintptr_t) ShadowHstPtrAddr < lb)
          continue;
        if ((uintptr_t) ShadowHstPtrAddr >= ub)
          break;

        // If we copied the struct to the host, we need to restore the pointer.
        if (arg_types[i] & OMP_TGT_MAPTYPE_FROM) {
          DP("Restoring original host pointer value " DPxMOD " for host "
              "pointer " DPxMOD "\n", DPxPTR(it->second.HstPtrVal),
              DPxPTR(ShadowHstPtrAddr));
          *ShadowHstPtrAddr = it->second.HstPtrVal;
        }
        // If the struct is to be deallocated, remove the shadow entry.
        if (DelEntry) {
          DP("Removing shadow pointer " DPxMOD "\n", DPxPTR(ShadowHstPtrAddr));
          Device.ShadowPtrMap.erase(it);
        }
      }
      Device.ShadowMtx.unlock();

      // Deallocate map
      if (DelEntry) {
        int rt = Device.deallocTgtPtr(HstPtrBegin, arg_sizes[i], ForceDelete);
        if (rt != OFFLOAD_SUCCESS) {
          DP("Deallocating data from device failed.\n");
          rc = OFFLOAD_FAIL;
        }
      }
    }
  }

  return rc;
}